

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_2.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  double dVar2;
  double c;
  
  std::istream::_M_extract<double>((double *)&std::cin);
  dVar2 = ctok(0.0);
  poVar1 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar1,'\n');
  return 0;
}

Assistant:

int main()
{
	double c = 0;// declare input variable
	std::cin >> c;// retrieve temperature to input variable
	double k = ctok(c);// convert temperature
	std::cout << k << '\n';// print out temperature
	return 0;
}